

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
          (cmNinjaTargetGenerator *this,cmNinjaVars *vars,string *config)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  cmLocalNinjaGenerator *pcVar4;
  string *psVar5;
  mapped_type *pmVar6;
  bool local_2a1;
  allocator<char> local_279;
  key_type local_278;
  string_view local_258;
  string local_248;
  allocator<char> local_221;
  key_type local_220;
  string_view local_200;
  string local_1f0;
  string local_1d0;
  cmAlphaNum local_1b0;
  string local_180;
  cmAlphaNum local_160;
  string local_130;
  undefined1 local_110 [8];
  string compilePdbPath;
  string pdbPath;
  string local_c8;
  cmValue local_a8;
  byte local_9b;
  byte local_9a;
  allocator<char> local_99;
  string local_98;
  cmValue local_78 [3];
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmMakefile *local_30;
  cmMakefile *mf;
  string *config_local;
  cmNinjaVars *vars_local;
  cmNinjaTargetGenerator *this_local;
  
  mf = (cmMakefile *)config;
  config_local = (string *)vars;
  vars_local = (cmNinjaVars *)this;
  pcVar3 = GetMakefile(this);
  local_30 = pcVar3;
  std::allocator<char>::allocator();
  local_9a = 0;
  local_9b = 0;
  pdbPath.field_2._M_local_buf[0xe] = '\0';
  pdbPath.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"MSVC_C_ARCHITECTURE_ID",&local_59);
  local_38 = cmMakefile::GetDefinition(pcVar3,&local_58);
  bVar1 = cmValue::operator_cast_to_bool(&local_38);
  pcVar3 = local_30;
  local_2a1 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_9a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"MSVC_CXX_ARCHITECTURE_ID",&local_99);
    local_9b = 1;
    local_78[0] = cmMakefile::GetDefinition(pcVar3,&local_98);
    bVar1 = cmValue::operator_cast_to_bool(local_78);
    pcVar3 = local_30;
    local_2a1 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      pdbPath.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"MSVC_CUDA_ARCHITECTURE_ID",
                 (allocator<char> *)(pdbPath.field_2._M_local_buf + 0xf));
      pdbPath.field_2._M_local_buf[0xd] = '\x01';
      local_a8 = cmMakefile::GetDefinition(pcVar3,&local_c8);
      local_2a1 = cmValue::operator_cast_to_bool(&local_a8);
    }
  }
  if ((pdbPath.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((pdbPath.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(pdbPath.field_2._M_local_buf + 0xf));
  }
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator(&local_99);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (local_2a1 == false) {
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)(compilePdbPath.field_2._M_local_buf + 8));
    cmCommonTargetGenerator::ComputeTargetCompilePDB
              ((string *)local_110,&this->super_cmCommonTargetGenerator,(string *)mf);
    TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar2 == EXECUTABLE) ||
         (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar2 == STATIC_LIBRARY)) ||
        (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar2 == SHARED_LIBRARY)) ||
       (TVar2 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar2 == MODULE_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (&local_180,(this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)mf);
      cmAlphaNum::cmAlphaNum(&local_160,&local_180);
      cmAlphaNum::cmAlphaNum(&local_1b0,'/');
      cmGeneratorTarget::GetPDBName
                (&local_1d0,(this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)mf);
      cmStrCat<std::__cxx11::string>(&local_130,&local_160,&local_1b0,&local_1d0);
      std::__cxx11::string::operator=
                ((string *)(compilePdbPath.field_2._M_local_buf + 8),(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_180);
    }
    pcVar4 = GetLocalGenerator(this);
    psVar5 = ConvertToNinjaPath(this,(string *)((long)&compilePdbPath.field_2 + 8));
    local_200 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_1f0,
               &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_200,SHELL);
    psVar5 = config_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"TARGET_PDB",&local_221)
    ;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)psVar5,&local_220);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string((string *)&local_1f0);
    pcVar4 = GetLocalGenerator(this);
    psVar5 = ConvertToNinjaPath(this,(string *)local_110);
    local_258 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_248,
               &(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_258,SHELL);
    psVar5 = config_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"TARGET_COMPILE_PDB",&local_279);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)psVar5,&local_278);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_248);
    EnsureParentDirectoryExists(this,(string *)((long)&compilePdbPath.field_2 + 8));
    EnsureParentDirectoryExists(this,(string *)local_110);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)(compilePdbPath.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(
  cmNinjaVars& vars, const std::string& config) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB(config);
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = cmStrCat(this->GeneratorTarget->GetPDBDirectory(config), '/',
                         this->GeneratorTarget->GetPDBName(config));
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    this->EnsureParentDirectoryExists(pdbPath);
    this->EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}